

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_CURSE_ARMOR(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  int iVar3;
  int16_t iVar4;
  uint32_t uVar5;
  object *obj;
  int iVar6;
  int iVar7;
  char o_name [80];
  
  obj = equipped_item_by_slot_name(player,"body");
  if (obj != (object *)0x0) {
    object_desc(o_name,0x50,obj,3,player);
    if ((obj->artifact == (artifact *)0x0) || (uVar5 = Rand_div(100), 0x31 < (int)uVar5)) {
      uVar5 = Rand_div(3);
      iVar6 = uVar5 + 1;
      msg("A terrible black aura blasts your %s!",o_name);
      uVar5 = Rand_div(3);
      obj->to_a = obj->to_a + ~(ushort)uVar5;
      iVar3 = 0x14;
      while( true ) {
        iVar7 = iVar3;
        if ((iVar6 == 0) || (iVar7 == 0)) break;
        uVar5 = Rand_div(z_info->curse_max - 1);
        iVar4 = m_bonus(9,(int)player->depth);
        iVar3 = iVar7 + -1;
        if (curses[uVar5 + L'\x01'].poss[obj->tval] != false) {
          append_object_curse(obj,uVar5 + L'\x01',iVar4 * 10);
          iVar6 = iVar6 + -1;
          iVar3 = iVar7;
        }
      }
      ppVar2 = player->upkeep;
      uVar1._0_4_ = ppVar2->update;
      uVar1._4_4_ = ppVar2->redraw;
      ppVar2->update = (int)(uVar1 | 0x6000000000009);
      ppVar2->redraw = (int)((uVar1 | 0x6000000000009) >> 0x20);
    }
    else {
      msg("A %s tries to %s, but your %s resists the effects!","terrible black aura",
          "surround your armor",o_name);
    }
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_CURSE_ARMOR(effect_handler_context_t *context)
{
	struct object *obj;

	char o_name[80];

	/* Curse the body armor */
	obj = equipped_item_by_slot_name(player, "body");

	/* Nothing to curse */
	if (!obj) return (true);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, player);

	/* Attempt a saving throw for artifacts */
	if (obj->artifact && (randint0(100) < 50)) {
		msg("A %s tries to %s, but your %s resists the effects!",
				   "terrible black aura", "surround your armor", o_name);
	} else {
		int num = randint1(3);
		int max_tries = 20;
		msg("A terrible black aura blasts your %s!", o_name);

		/* Take down bonus a wee bit */
		obj->to_a -= randint1(3);

		/* Try to find enough appropriate curses */
		while (num && max_tries) {
			int pick = randint1(z_info->curse_max - 1);
			int power = 10 * m_bonus(9, player->depth);
			if (!curses[pick].poss[obj->tval]) {
				max_tries--;
				continue;
			}
			append_object_curse(obj, pick, power);
			num--;
		}

		/* Recalculate bonuses */
		player->upkeep->update |= (PU_BONUS);

		/* Recalculate mana */
		player->upkeep->update |= (PU_MANA);

		/* Window stuff */
		player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	}

	context->ident = true;

	return (true);
}